

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O2

void duckdb::VectorOperations::CombineHash
               (Vector *hashes,Vector *input,SelectionVector *rsel,idx_t count)

{
  data_ptr_t pdVar1;
  PhysicalType PVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  idx_t iVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference pvVar6;
  type pVVar7;
  Vector *input_00;
  InvalidTypeException *this_00;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __n;
  UnifiedVectorFormat *this_01;
  ulong uVar11;
  idx_t i;
  ulong uVar12;
  idx_t i_1;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  ulong uVar16;
  SelectionVector array_sel;
  sel_t *local_178 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  Vector *local_160;
  ulong local_158;
  SelectionVector *local_150;
  Vector array_hashes;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat idata_1;
  
  PVar2 = (input->type).physical_type_;
  switch(PVar2) {
  case BOOL:
  case INT8:
    TemplatedLoopCombineHash<true,signed_char>(input,hashes,rsel,count);
    return;
  case UINT8:
    TemplatedLoopCombineHash<true,unsigned_char>(input,hashes,rsel,count);
    return;
  case UINT16:
    TemplatedLoopCombineHash<true,unsigned_short>(input,hashes,rsel,count);
    return;
  case INT16:
    TemplatedLoopCombineHash<true,short>(input,hashes,rsel,count);
    return;
  case UINT32:
    TemplatedLoopCombineHash<true,unsigned_int>(input,hashes,rsel,count);
    return;
  case INT32:
    TemplatedLoopCombineHash<true,int>(input,hashes,rsel,count);
    return;
  case UINT64:
    TemplatedLoopCombineHash<true,unsigned_long>(input,hashes,rsel,count);
    return;
  case INT64:
    TemplatedLoopCombineHash<true,long>(input,hashes,rsel,count);
    return;
  case FLOAT:
    TemplatedLoopCombineHash<true,float>(input,hashes,rsel,count);
    return;
  case DOUBLE:
    TemplatedLoopCombineHash<true,double>(input,hashes,rsel,count);
    return;
  case INTERVAL:
    TemplatedLoopCombineHash<true,duckdb::interval_t>(input,hashes,rsel,count);
    return;
  case LIST:
    Vector::Flatten(hashes,count);
    pdVar3 = hashes->data;
    UnifiedVectorFormat::UnifiedVectorFormat(&idata_1);
    Vector::ToUnifiedFormat(input,count,&idata_1);
    input_00 = ListVector::GetEntry(input);
    iVar5 = ListVector::GetListSize(input);
    LogicalType::LogicalType((LogicalType *)&idata,UBIGINT);
    Vector::Vector(&array_hashes,(LogicalType *)&idata,iVar5);
    LogicalType::~LogicalType((LogicalType *)&idata);
    if (iVar5 != 0) {
      Hash(input_00,&array_hashes,iVar5);
      Vector::Flatten(&array_hashes,iVar5);
    }
    SelectionVector::SelectionVector(&array_sel,count);
    SelectionVector::SelectionVector((SelectionVector *)local_178,0x800);
    psVar4 = rsel->sel_vector;
    uVar10 = 0;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      iVar8 = iVar5;
      if (psVar4 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar4[iVar5];
      }
      iVar14 = iVar8;
      if ((idata_1.sel)->sel_vector != (sel_t *)0x0) {
        iVar14 = (idx_t)(idata_1.sel)->sel_vector[iVar8];
      }
      if (((idata_1.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((idata_1.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar14 >> 6]
            >> (iVar14 & 0x3f) & 1) != 0)) &&
         (*(long *)((long)(idata_1.data + iVar14 * 0x10) + 8) != 0)) {
        array_sel.sel_vector[uVar10] = (sel_t)iVar8;
        uVar10 = uVar10 + 1;
        local_178[0][iVar8] = *(sel_t *)(idata_1.data + iVar14 * 0x10);
      }
    }
    if (uVar10 != 0) {
      psVar4 = (idata_1.sel)->sel_vector;
      uVar11 = 1;
      do {
        uVar12 = 0;
        for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
          uVar15 = uVar13;
          if (array_sel.sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)array_sel.sel_vector[uVar13];
          }
          uVar9 = uVar15;
          if (local_178[0] != (sel_t *)0x0) {
            uVar9 = (ulong)local_178[0][uVar15];
          }
          uVar16 = *(ulong *)(pdVar3 + uVar15 * 8);
          *(ulong *)(pdVar3 + uVar15 * 8) =
               (uVar16 >> 0x20 ^ uVar16) * -0x2917014799a6026d ^
               *(ulong *)(array_hashes.data + uVar9 * 8);
          uVar16 = uVar15;
          if (psVar4 != (sel_t *)0x0) {
            uVar16 = (ulong)psVar4[uVar15];
          }
          if (uVar11 < *(ulong *)(idata_1.data + uVar16 * 0x10 + 8)) {
            array_sel.sel_vector[uVar12] = (sel_t)uVar15;
            uVar12 = uVar12 + 1;
            local_178[0][uVar15] = (int)uVar9 + 1;
          }
        }
        uVar11 = uVar11 + 1;
        uVar10 = uVar12;
      } while (uVar12 != 0);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&array_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Vector::~Vector(&array_hashes);
    this_01 = &idata_1;
    break;
  case STRUCT:
    this = StructVector::GetEntries(input);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this,0);
    pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar6);
    CombineHash(hashes,pVVar7,rsel,count);
    for (__n = 1; __n < (ulong)((long)(this->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1
        ) {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::get<true>(this,__n);
      pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar6);
      CombineHash(hashes,pVVar7,rsel,count);
    }
    return;
  case ARRAY:
    local_150 = rsel;
    Vector::Flatten(hashes,count);
    pdVar3 = hashes->data;
    UnifiedVectorFormat::UnifiedVectorFormat(&idata);
    Vector::ToUnifiedFormat(input,count,&idata);
    local_160 = ArrayVector::GetEntry(input);
    iVar5 = ArrayType::GetSize(&input->type);
    SelectionVector::SelectionVector(&array_sel,iVar5);
    LogicalType::LogicalType((LogicalType *)local_178,UBIGINT);
    Vector::Vector(&array_hashes,(LogicalType *)local_178,iVar5);
    LogicalType::~LogicalType((LogicalType *)local_178);
    local_158 = count;
    for (uVar10 = 0; uVar10 != local_158; uVar10 = uVar10 + 1) {
      uVar11 = uVar10;
      if (local_150->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)local_150->sel_vector[uVar10];
      }
      uVar12 = uVar11;
      if ((idata.sel)->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)(idata.sel)->sel_vector[uVar11];
      }
      if ((idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar12 >> 6] >>
           (uVar12 & 0x3f) & 1) != 0)) {
        for (iVar8 = 0; iVar5 != iVar8; iVar8 = iVar8 + 1) {
          array_sel.sel_vector[iVar8] = (int)uVar12 * (int)iVar5 + (int)iVar8;
        }
        Vector::Vector((Vector *)&idata_1,local_160,&array_sel,iVar5);
        Hash((Vector *)&idata_1,&array_hashes,iVar5);
        for (iVar8 = 0; iVar5 != iVar8; iVar8 = iVar8 + 1) {
          uVar12 = *(ulong *)(pdVar3 + uVar11 * 8);
          *(ulong *)(pdVar3 + uVar11 * 8) =
               (uVar12 >> 0x20 ^ uVar12) * -0x2917014799a6026d ^
               *(ulong *)(array_hashes.data + iVar8 * 8);
          pdVar1 = array_hashes.data + iVar8 * 8;
          pdVar1[0] = '\0';
          pdVar1[1] = '\0';
          pdVar1[2] = '\0';
          pdVar1[3] = '\0';
          pdVar1[4] = '\0';
          pdVar1[5] = '\0';
          pdVar1[6] = '\0';
          pdVar1[7] = '\0';
        }
        Vector::~Vector((Vector *)&idata_1);
      }
    }
    Vector::~Vector(&array_hashes);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&array_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this_01 = &idata;
    break;
  default:
    if (PVar2 == VARCHAR) {
      TemplatedLoopCombineHash<true,duckdb::string_t>(input,hashes,rsel,count);
      return;
    }
    if (PVar2 == UINT128) {
      TemplatedLoopCombineHash<true,duckdb::uhugeint_t>(input,hashes,rsel,count);
      return;
    }
    if (PVar2 == INT128) {
      TemplatedLoopCombineHash<true,duckdb::hugeint_t>(input,hashes,rsel,count);
      return;
    }
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
    this_00 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&array_hashes,"Invalid type for hash",(allocator *)&idata_1);
    InvalidTypeException::InvalidTypeException(this_00,&input->type,(string *)&array_hashes);
    __cxa_throw(this_00,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(this_01);
  return;
}

Assistant:

void VectorOperations::CombineHash(Vector &hashes, Vector &input, const SelectionVector &rsel, idx_t count) {
	CombineHashTypeSwitch<true>(hashes, input, &rsel, count);
}